

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O1

void __thiscall Centaurus::ATNMachine<char>::parse_atom(ATNMachine<char> *this,Stream *stream)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer pAVar5;
  wchar_t wVar6;
  StreamException *__return_storage_ptr__;
  int iVar7;
  vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>> *this_00;
  ATNNode<char> node;
  ATNNodeType local_d0 [2];
  ATNNode<char> local_c8;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  wVar6 = Stream::skip_whitespace(stream);
  pAVar3 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar4 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (wVar6 == L'(') {
    Stream::get(stream);
    parse_selection(this,stream);
    wVar6 = Stream::skip_whitespace(stream);
    if (wVar6 != L')') {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,wVar6);
      __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                  StreamException::~StreamException);
    }
    Stream::get(stream);
  }
  else {
    ATNNode<char>::ATNNode(&local_c8,stream);
    if ((0 < this->m_globalid) && ((local_c8.m_type & ~Nonterminal) == LiteralTerminal)) {
      pAVar5 = (this->m_nodes).
               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d0[0] = (int)((ulong)((long)pAVar5 -
                                 (long)(this->m_nodes).
                                       super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b
      ;
      local_d0[1] = 0;
      std::vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>::
      emplace_back<int&,int&>
                ((vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
                  *)&pAVar5[-1].m_transitions,(int *)local_d0,(int *)(local_d0 + 1));
      local_d0[0] = WhiteSpace;
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
      emplace_back<Centaurus::ATNNodeType>(&this->m_nodes,local_d0);
    }
    pAVar5 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_d0[0] = (int)((ulong)((long)pAVar5 -
                               (long)(this->m_nodes).
                                     super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b;
    local_d0[1] = 0;
    std::vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>::
    emplace_back<int&,int&>
              ((vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
                *)&pAVar5[-1].m_transitions,(int *)local_d0,(int *)(local_d0 + 1));
    std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::push_back
              (&this->m_nodes,&local_c8);
    ATNNode<char>::~ATNNode(&local_c8);
  }
  iVar7 = (int)((ulong)((long)pAVar1 - (long)pAVar2) >> 3) * 0x286bca1b + -1;
  wVar6 = Stream::skip_whitespace(stream);
  if (wVar6 == L'?') {
    add_node(this,(int)((ulong)((long)(this->m_nodes).
                                      super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_nodes).
                                     super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b +
                  -1,0);
    pAVar1 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c8._vptr_ATNNode._0_4_ =
         (int)((ulong)((long)(this->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 3) *
         0x286bca1b + -1;
    this_00 = (vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
               *)&pAVar1[iVar7].m_transitions;
  }
  else {
    local_c8._vptr_ATNNode._0_4_ = (int)((ulong)((long)pAVar3 - (long)pAVar4) >> 3) * 0x286bca1b;
    if (wVar6 == L'+') {
      add_node(this,(int)((ulong)((long)(this->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_nodes).
                                       super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b
                    + -1,0);
      this_00 = (vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
                 *)&(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].m_transitions;
    }
    else {
      if (wVar6 != L'*') {
        return;
      }
      add_node(this,(int)((ulong)((long)(this->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_nodes).
                                       super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b
                    + -1,0);
      local_d0[0] = Blank;
      std::vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>::
      emplace_back<int&,int&>
                ((vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
                  *)&(this->m_nodes).
                     super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].m_transitions,(int *)&local_c8,
                 (int *)local_d0);
      add_node(this,(int)((ulong)((long)(this->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_nodes).
                                       super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b
                    + -1,0);
      pAVar1 = (this->m_nodes).
               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
                 *)&pAVar1[iVar7].m_transitions;
      local_c8._vptr_ATNNode._0_4_ =
           (int)((ulong)((long)(this->m_nodes).
                               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 3) *
           0x286bca1b + -1;
    }
  }
  local_d0[0] = Blank;
  std::vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>::
  emplace_back<int&,int&>(this_00,(int *)&local_c8,(int *)local_d0);
  Stream::get(stream);
  return;
}

Assistant:

void ATNMachine<TCHAR>::parse_atom(Stream& stream)
{
	int origin_state = m_nodes.size() - 1;
	wchar_t ch = stream.skip_whitespace();

	int anchor_state = m_nodes.size();

	if (ch == L'(')
	{
		stream.discard();
		parse_selection(stream);

		ch = stream.skip_whitespace();
		if (ch != L')')
			throw stream.unexpected(ch);
		stream.discard();
	}
	else
	{
        ATNNode<TCHAR> node(stream);

        if (m_globalid > 0 && (node.type() == ATNNodeType::LiteralTerminal || node.type() == ATNNodeType::RegularTerminal))
        {
            m_nodes.back().add_transition(m_nodes.size());
            m_nodes.emplace_back(ATNNodeType::WhiteSpace);
        }

		m_nodes.back().add_transition(m_nodes.size());
		m_nodes.push_back(node);
	}

	ch = stream.skip_whitespace();
	switch (ch)
	{
	case L'*':
		add_node(m_nodes.size() - 1);
		m_nodes.back().add_transition(anchor_state);
		add_node(m_nodes.size() - 1);
		m_nodes[origin_state].add_transition(m_nodes.size() - 1);
		stream.discard();
		break;
	case L'+':
		add_node(m_nodes.size() - 1);
		m_nodes.back().add_transition(anchor_state);
		stream.discard();
		break;
	case L'?':
		add_node(m_nodes.size() - 1);
		m_nodes[origin_state].add_transition(m_nodes.size() - 1);
		stream.discard();
		break;
	}
}